

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

string * bssl::GetTempDir_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_12;
  allocator<char> local_11;
  
  __s = getenv("TMPDIR");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"/tmp/",&local_12);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_11);
    if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

static std::string GetTempDir() {
#if defined(OPENSSL_WINDOWS)
  char buf[MAX_PATH + 1];
  DWORD len = GetTempPathA(sizeof(buf), buf);
  return std::string(buf, len);
#else
  const char *tmpdir = getenv("TMPDIR");
  if (tmpdir != nullptr && *tmpdir != '\0') {
    std::string ret = tmpdir;
    if (ret.back() != '/') {
      ret.push_back('/');
    }
    return ret;
  }
#if defined(OPENSSL_ANDROID)
  return "/data/local/tmp/";
#else
  return "/tmp/";
#endif
#endif
}